

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O1

void __thiscall QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArray *pattern)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  
  this->d = (QByteArrayMatcherPrivate *)0x0;
  pDVar1 = (pattern->d).d;
  (this->q_pattern).d.d = pDVar1;
  (this->q_pattern).d.ptr = (pattern->d).ptr;
  (this->q_pattern).d.size = (pattern->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pcVar6 = (pattern->d).ptr;
  if ((uchar *)pcVar6 == (uchar *)0x0) {
    pcVar6 = "";
  }
  (this->field_2).p.p = (uchar *)pcVar6;
  lVar2 = (pattern->d).size;
  (this->field_2).p.l = lVar2;
  lVar5 = 0xff;
  if (lVar2 < 0xff) {
    lVar5 = lVar2;
  }
  memset(&this->field_2,(int)lVar5,0x100);
  if (lVar2 != 0) {
    cVar4 = (char)lVar5;
    lVar3 = 0;
    do {
      cVar4 = cVar4 + -1;
      *(char *)((long)&this->field_2 + (ulong)((uchar *)pcVar6)[lVar3 + (lVar2 - lVar5)]) = cVar4;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != (int)lVar5);
  }
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArray &pattern)
    : d(nullptr), q_pattern(pattern)
{
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}